

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O1

bool __thiscall pfd::internal::executor::ready(executor *this,int timeout)

{
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  int status;
  char buf [8192];
  undefined4 local_204c;
  timespec local_2048;
  long local_2038 [2];
  undefined1 local_2028 [8200];
  
  bVar1 = true;
  if (this->m_running == true) {
    sVar4 = read(this->m_fd,local_2028,0x2000);
    if (sVar4 < 1) {
      _Var2 = waitpid(this->m_pid,&local_204c,1);
      if ((_Var2 == this->m_pid) || ((_Var2 < 0 && (piVar5 = __errno_location(), *piVar5 == 10)))) {
        close(this->m_fd);
        this->m_exit_code = (uint)local_204c._1_1_;
        this->m_running = false;
        return true;
      }
      if (0 < timeout) {
        local_2048.tv_sec = (ulong)(uint)timeout / 1000;
        local_2048.tv_nsec = ((ulong)(uint)timeout % 1000) * 1000000;
        do {
          iVar3 = nanosleep(&local_2048,&local_2048);
          if (iVar3 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      }
    }
    else {
      local_2048.tv_sec = (__time_t)local_2038;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2048,local_2028,local_2028 + sVar4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&this->m_stdout,(char *)local_2048.tv_sec,local_2048.tv_nsec);
      if ((long *)local_2048.tv_sec != local_2038) {
        operator_delete((void *)local_2048.tv_sec,local_2038[0] + 1);
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool internal::executor::ready(int timeout /* = default_wait_timeout */)
{
    if (!m_running)
        return true;

#if _WIN32
    if (m_future.valid())
    {
        auto status = m_future.wait_for(std::chrono::milliseconds(timeout));
        if (status != std::future_status::ready)
        {
            // On Windows, we need to run the message pump. If the async
            // thread uses a Windows API dialog, it may be attached to the
            // main thread and waiting for messages that only we can dispatch.
            MSG msg;
            while (PeekMessage(&msg, nullptr, 0, 0, PM_REMOVE))
            {
                TranslateMessage(&msg);
                DispatchMessage(&msg);
            }
            return false;
        }

        m_stdout = m_future.get();
    }
#elif __EMSCRIPTEN__ || __NX__
    // FIXME: do something
    (void)timeout;
#else
    char buf[BUFSIZ];
    ssize_t received = read(m_fd, buf, BUFSIZ); // Flawfinder: ignore
    if (received > 0)
    {
        m_stdout += std::string(buf, received);
        return false;
    }

    // Reap child process if it is dead. It is possible that the system has already reaped it
    // (this happens when the calling application handles or ignores SIG_CHLD) and results in
    // waitpid() failing with ECHILD. Otherwise we assume the child is running and we sleep for
    // a little while.
    int status;
    pid_t child = waitpid(m_pid, &status, WNOHANG);
    if (child != m_pid && (child >= 0 || errno != ECHILD))
    {
        // FIXME: this happens almost always at first iteration
        std::this_thread::sleep_for(std::chrono::milliseconds(timeout));
        return false;
    }

    close(m_fd);
    m_exit_code = WEXITSTATUS(status);
#endif

    m_running = false;
    return true;
}